

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8_x509.cc
# Opt level: O0

int pkcs12_iterations_acceptable(uint64_t iterations)

{
  bool local_11;
  uint64_t iterations_local;
  
  local_11 = iterations != 0 && iterations < 0x5f5e101;
  return (int)local_11;
}

Assistant:

int pkcs12_iterations_acceptable(uint64_t iterations) {
#if defined(FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION)
  static const uint64_t kIterationsLimit = 2048;
#else
  // Windows imposes a limit of 600K. Mozilla say: “so them increasing
  // maximum to something like 100M or 1G (to have few decades of breathing
  // room) would be very welcome”[1]. So here we set the limit to 100M.
  //
  // [1] https://bugzilla.mozilla.org/show_bug.cgi?id=1436873#c14
  static const uint64_t kIterationsLimit = 100 * 1000000;
#endif

  assert(kIterationsLimit <= UINT32_MAX);
  return 0 < iterations && iterations <= kIterationsLimit;
}